

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O1

int pybind11::detail::
    process_attributes<pybind11::name,_pybind11::is_method,_pybind11::sibling,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v>
    ::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  process_attribute<pybind11::arg,_void> *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  process_attribute<pybind11::arg,_void> *in_R8;
  process_attribute<pybind11::arg,_void> *in_R9;
  process_attribute<pybind11::arg,_void> *in_stack_00000008;
  process_attribute<pybind11::arg,_void> *in_stack_00000010;
  process_attribute<pybind11::arg_v,_void> *in_stack_00000018;
  process_attribute<pybind11::arg_v,_void> *in_stack_00000020;
  process_attribute<pybind11::arg_v,_void> *in_stack_00000028;
  EVP_PKEY_CTX *in_stack_00000030;
  
  *(undefined8 *)in_stack_00000030 = *(undefined8 *)ctx;
  in_stack_00000030[0x59] = (EVP_PKEY_CTX)((byte)in_stack_00000030[0x59] | 0x10);
  *(undefined8 *)(in_stack_00000030 + 0x70) = *in_RSI;
  *(undefined8 *)(in_stack_00000030 + 0x78) = *in_RDX;
  process_attribute<pybind11::arg,_void>::init(in_RCX,in_stack_00000030);
  process_attribute<pybind11::arg,_void>::init(in_R8,in_stack_00000030);
  process_attribute<pybind11::arg,_void>::init(in_R9,in_stack_00000030);
  process_attribute<pybind11::arg,_void>::init(in_stack_00000008,in_stack_00000030);
  process_attribute<pybind11::arg,_void>::init(in_stack_00000010,in_stack_00000030);
  process_attribute<pybind11::arg_v,_void>::init(in_stack_00000018,in_stack_00000030);
  process_attribute<pybind11::arg_v,_void>::init(in_stack_00000020,in_stack_00000030);
  iVar1 = process_attribute<pybind11::arg_v,_void>::init(in_stack_00000028,in_stack_00000030);
  return iVar1;
}

Assistant:

static void init(const Args&... args, function_record *r) {
        int unused[] = { 0, (process_attribute<typename std::decay<Args>::type>::init(args, r), 0) ... };
        ignore_unused(unused);
    }